

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLDateTime::fillString(XMLDateTime *this,XMLCh **ptr,int value,XMLSize_t expLen)

{
  XMLCh XVar1;
  XMLCh *pXVar2;
  XMLSize_t XVar3;
  XMLCh *pXVar4;
  XMLSize_t XVar5;
  XMLCh strBuffer [16];
  
  if (expLen < 0x10) {
    XMLString::binToText(value,strBuffer,expLen,10,this->fMemoryManager);
    XVar3 = XMLString::stringLen(strBuffer);
    pXVar2 = *ptr;
    for (; pXVar4 = pXVar2 + 1, XVar3 != expLen; expLen = expLen - 1) {
      *ptr = pXVar4;
      *pXVar2 = L'0';
      pXVar2 = pXVar4;
    }
    for (XVar5 = 0; XVar3 != XVar5; XVar5 = XVar5 + 1) {
      XVar1 = strBuffer[XVar5];
      *ptr = pXVar4;
      pXVar4[-1] = XVar1;
      pXVar4 = pXVar4 + 1;
    }
    return;
  }
  __assert_fail("expLen < 16",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                ,0x749,"void xercesc_4_0::XMLDateTime::fillString(XMLCh *&, int, XMLSize_t) const");
}

Assistant:

void XMLDateTime::fillString(XMLCh*& ptr, int value, XMLSize_t expLen) const
{
    XMLCh strBuffer[16];
    assert(expLen < 16);
    XMLString::binToText(value, strBuffer, expLen, 10, fMemoryManager);
    XMLSize_t actualLen = XMLString::stringLen(strBuffer);
    XMLSize_t i;
    //append leading zeros
    for (i = 0; i < expLen - actualLen; i++)
    {
        *ptr++ = chDigit_0;
    }

    for (i = 0; i < actualLen; i++)
    {
        *ptr++ = strBuffer[i];
    }

}